

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O0

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
lf::uscalfe::FeLagrangeO3Quad<double>::EvalReferenceShapeFunctions
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,FeLagrangeO3Quad<double> *this,
          MatrixXd *refcoords)

{
  Index IVar1;
  CoeffReturnType piVar2;
  RowXpr local_568;
  RowXpr local_530;
  RowXpr local_4f8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  local_4c0;
  MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
  local_448;
  int local_3d0;
  int i;
  MatrixXd local_390;
  Matrix<double,__1,__1,_0,__1,__1> local_378;
  NestedExpressionType local_360;
  undefined1 local_358 [8];
  Array<double,__1,__1,_0,__1,__1> segment_x1_eval;
  ConstRowXpr local_338;
  MatrixXd local_300;
  Matrix<double,__1,__1,_0,__1,__1> local_2e8;
  NestedExpressionType local_2d0;
  undefined1 local_2c8 [8];
  Array<double,__1,__1,_0,__1,__1> segment_x0_eval;
  int local_2a8;
  byte local_2a1;
  undefined4 local_2a0;
  allocator<char> local_299;
  size_type n_pts;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_20;
  MatrixXd *refcoords_local;
  FeLagrangeO3Quad<double> *this_local;
  Matrix<double,__1,__1,_0,__1,__1> *result;
  
  local_20 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)refcoords;
  refcoords_local = (MatrixXd *)this;
  this_local = (FeLagrangeO3Quad<double> *)__return_storage_ptr__;
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  if (IVar1 != 2) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::operator<<(local_198,"Reference coordinates must be 2-vectors");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"refcoords.rows() == 2",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
               ,&local_201);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d8,&local_200,0x536,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"false",&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
               ,&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&n_pts,"",&local_299);
    lf::base::AssertionFailed(&local_248,&local_270,0x536,(string *)&n_pts);
    std::__cxx11::string::~string((string *)&n_pts);
    std::allocator<char>::~allocator(&local_299);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    abort();
  }
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
  local_2a0 = (undefined4)IVar1;
  local_2a1 = 0;
  local_2a8 = 0x10;
  segment_x0_eval.super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                 ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,&local_2a8,
             &segment_x0_eval.super_PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row(&local_338,local_20,0);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_300,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)&local_338);
  FeLagrangeO3Segment<double>::EvalReferenceShapeFunctions
            (&local_2e8,(FeLagrangeO3Segment<double> *)&krsf_segment_,&local_300);
  local_2d0 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array
                        ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_2e8);
  Eigen::Array<double,-1,-1,0,-1,-1>::
  Array<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Array<double,_1,_1,0,_1,_1> *)local_2c8,&local_2d0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_2e8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_300);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row((ConstRowXpr *)&i,local_20,1);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_390,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)&i);
  FeLagrangeO3Segment<double>::EvalReferenceShapeFunctions
            (&local_378,(FeLagrangeO3Segment<double> *)&krsf_segment_,&local_390);
  local_360 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array
                        ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_378);
  Eigen::Array<double,-1,-1,0,-1,-1>::
  Array<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Array<double,_1,_1,0,_1,_1> *)local_358,&local_360);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_378);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_390);
  for (local_3d0 = 0; local_3d0 < 0x10; local_3d0 = local_3d0 + 1) {
    piVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_16,_2,_0,_16,_2>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,_16,_2,_0,_16,_2>,_0> *)
                        ksegment_to_quad_mapping_,(long)local_3d0,0);
    Eigen::DenseBase<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_4f8,(DenseBase<Eigen::Array<double,__1,__1,_0,__1,__1>_> *)local_2c8,
               (long)*piVar2);
    piVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_16,_2,_0,_16,_2>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<int,_16,_2,_0,_16,_2>,_0> *)
                        ksegment_to_quad_mapping_,(long)local_3d0,1);
    Eigen::DenseBase<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_530,(DenseBase<Eigen::Array<double,__1,__1,_0,__1,__1>_> *)local_358,
               (long)*piVar2);
    Eigen::ArrayBase<Eigen::Block<Eigen::Array<double,-1,-1,0,-1,-1>,1,-1,false>>::operator*
              (&local_4c0,
               (ArrayBase<Eigen::Block<Eigen::Array<double,_1,_1,0,_1,_1>,1,_1,false>> *)&local_4f8,
               (ArrayBase<Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
               &local_530);
    Eigen::
    ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Block<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
    ::matrix(&local_448,
             (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
              *)&local_4c0);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_568,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)__return_storage_ptr__,
               (long)local_3d0);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&local_568,
               (DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Array<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
                *)&local_448);
  }
  local_2a1 = 1;
  Eigen::Array<double,_-1,_-1,_0,_-1,_-1>::~Array((Array<double,__1,__1,_0,__1,__1> *)local_358);
  Eigen::Array<double,_-1,_-1,_0,_-1,_-1>::~Array((Array<double,__1,__1,_0,__1,__1> *)local_2c8);
  if ((local_2a1 & 1) == 0) {
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>
  EvalReferenceShapeFunctions(const Eigen::MatrixXd& refcoords) const override {
    LF_ASSERT_MSG(refcoords.rows() == 2,
                  "Reference coordinates must be 2-vectors");

    const size_type n_pts(refcoords.cols());
    Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic> result(
        16, refcoords.cols());

    // evaluate "segment" shape functions (b^j and b^l)
    Eigen::Array<SCALAR, Eigen::Dynamic, Eigen::Dynamic> segment_x0_eval =
        (krsf_segment_.EvalReferenceShapeFunctions(refcoords.row(0))).array();
    Eigen::Array<SCALAR, Eigen::Dynamic, Eigen::Dynamic> segment_x1_eval =
        (krsf_segment_.EvalReferenceShapeFunctions(refcoords.row(1))).array();

    // Evaluate basis functions using the tensor product structure
    for (int i = 0; i < 16; ++i) {
      result.row(i) = (segment_x0_eval.row(ksegment_to_quad_mapping_(i, 0)) *
                       segment_x1_eval.row(ksegment_to_quad_mapping_(i, 1)))
                          .matrix();
    }
    return result;
  }